

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffmahd(fitsfile *fptr,int hdunum,int *exttype,int *status)

{
  int iVar1;
  LONGLONG *pLVar2;
  int local_a4;
  LONGLONG *ptr;
  char message [81];
  int local_38;
  int local_34;
  int tstatus;
  int moveto;
  int *status_local;
  int *exttype_local;
  fitsfile *pfStack_18;
  int hdunum_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (hdunum < 1) {
      *status = 0x12d;
      fptr_local._4_4_ = 0x12d;
    }
    else {
      _tstatus = status;
      status_local = exttype;
      exttype_local._4_4_ = hdunum;
      pfStack_18 = fptr;
      if (fptr->Fptr->MAXHDU <= hdunum) {
        pLVar2 = (LONGLONG *)realloc(fptr->Fptr->headstart,(long)(hdunum + 0x3e9) << 3);
        if (pLVar2 == (LONGLONG *)0x0) {
          *_tstatus = 0x71;
          return 0x71;
        }
        pfStack_18->Fptr->MAXHDU = exttype_local._4_4_ + 1000;
        pfStack_18->Fptr->headstart = pLVar2;
      }
      pfStack_18->HDUposition = pfStack_18->Fptr->curhdu;
      do {
        if (pfStack_18->Fptr->curhdu + 1U == exttype_local._4_4_) {
          if (status_local != (int *)0x0) {
            ffghdt(pfStack_18,status_local,_tstatus);
          }
          return *_tstatus;
        }
        if ((int)(exttype_local._4_4_ - 1) < pfStack_18->Fptr->maxhdu + 1) {
          local_a4 = exttype_local._4_4_ - 1;
        }
        else {
          local_a4 = pfStack_18->Fptr->maxhdu + 1;
        }
        local_34 = local_a4;
        if (pfStack_18->Fptr->headstart[local_a4] < pfStack_18->Fptr->logfilesize) {
          iVar1 = ffchdu(pfStack_18,_tstatus);
          if ((iVar1 < 1) && (iVar1 = ffgext(pfStack_18,local_34,status_local,_tstatus), 0 < iVar1))
          {
            local_38 = 0;
            ffrhdu(pfStack_18,status_local,&local_38);
          }
        }
        else {
          *_tstatus = 0x6b;
        }
      } while (*_tstatus < 1);
      if (*_tstatus != 0x6b) {
        snprintf((char *)&ptr,0x51,"Failed to move to HDU number %d (ffmahd).",
                 (ulong)exttype_local._4_4_);
        ffpmsg((char *)&ptr);
      }
      fptr_local._4_4_ = *_tstatus;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffmahd(fitsfile *fptr,      /* I - FITS file pointer             */
           int hdunum,          /* I - number of the HDU to move to  */
           int *exttype,        /* O - type of extension, 0, 1, or 2 */
           int *status)         /* IO - error status                 */
/*
  Move to Absolute Header Data unit.  Move to the specified HDU
  and read the header to initialize the table structure.  Note that extnum 
  is one based, so the primary array is extnum = 1.
*/
{
    int moveto, tstatus;
    char message[FLEN_ERRMSG];
    LONGLONG *ptr;

    if (*status > 0)
        return(*status);
    else if (hdunum < 1 )
        return(*status = BAD_HDU_NUM);
    else if (hdunum >= (fptr->Fptr)->MAXHDU )
    {
        /* allocate more space for the headstart array */
        ptr = (LONGLONG*) realloc( (fptr->Fptr)->headstart,
                        (hdunum + 1001) * sizeof(LONGLONG) ); 

        if (ptr == NULL)
           return (*status = MEMORY_ALLOCATION);
        else {
          (fptr->Fptr)->MAXHDU = hdunum + 1000; 
          (fptr->Fptr)->headstart = ptr;
        }
    }

    /* set logical HDU position to the actual position, in case they differ */
    fptr->HDUposition = (fptr->Fptr)->curhdu;

    while( ((fptr->Fptr)->curhdu) + 1 != hdunum) /* at the correct HDU? */
    {
        /* move directly to the extension if we know that it exists,
           otherwise move to the highest known extension.  */
        
        moveto = minvalue(hdunum - 1, ((fptr->Fptr)->maxhdu) + 1);

        /* test if HDU exists */
        if ((fptr->Fptr)->headstart[moveto] < (fptr->Fptr)->logfilesize )
        {
            if (ffchdu(fptr, status) <= 0)  /* close out the current HDU */
            {
                if (ffgext(fptr, moveto, exttype, status) > 0)
                {   /* failed to get the requested extension */

                    tstatus = 0;
                    ffrhdu(fptr, exttype, &tstatus); /* restore the CHDU */
                }
            }
        }
        else
            *status = END_OF_FILE;

        if (*status > 0)
        {
            if (*status != END_OF_FILE)
            {
                /* don't clutter up the message stack in the common case of */
                /* simply hitting the end of file (often an expected error) */

                snprintf(message,FLEN_ERRMSG,
                "Failed to move to HDU number %d (ffmahd).", hdunum);
                ffpmsg(message);
            }
            return(*status);
        }
    }

    /* return the type of HDU; tile compressed images which are stored */
    /* in a binary table will return exttype = IMAGE_HDU, not BINARY_TBL */
    if (exttype != NULL)
        ffghdt(fptr, exttype, status);

    return(*status);
}